

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

void __thiscall lf::base::AutoTimer::Report(AutoTimer *this)

{
  add_pointer_t<std::basic_ostream<char>_*> ppbVar1;
  ostream *poVar2;
  variant_alternative_t<1UL,_variant<basic_ostream<char>_*,_pair<shared_ptr<logger>,_level_enum>_>_>
  *pvVar3;
  element_type *this_00;
  __sv_type format;
  type *ostream;
  undefined1 local_30 [8];
  string string;
  AutoTimer *this_local;
  
  string.field_2._8_8_ = this;
  format = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->format_);
  Timer::Format_abi_cxx11_((string *)local_30,&this->timer_,format);
  ppbVar1 = std::
            get_if<std::ostream*,std::ostream*,std::pair<std::shared_ptr<spdlog::logger>,spdlog::level::level_enum>>
                      (&this->output_);
  if (ppbVar1 == (add_pointer_t<std::basic_ostream<char>_*>)0x0) {
    pvVar3 = std::
             get<1ul,std::ostream*,std::pair<std::shared_ptr<spdlog::logger>,spdlog::level::level_enum>>
                       (&this->output_);
    this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)pvVar3);
    pvVar3 = std::
             get<1ul,std::ostream*,std::pair<std::shared_ptr<spdlog::logger>,spdlog::level::level_enum>>
                       (&this->output_);
    spdlog::logger::log<std::__cxx11::string>
              (this_00,pvVar3->second,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  }
  else {
    poVar2 = std::operator<<(*ppbVar1,(string *)local_30);
    std::operator<<(poVar2,'\n');
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void AutoTimer::Report() {
  auto string = timer_.Format(format_);
  if (auto* ostream = std::get_if<std::ostream*>(&output_)) {
    (**ostream) << string << '\n';
  } else {
    std::get<1>(output_).first->log(std::get<1>(output_).second, string);
  }
}